

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexerScanner.cpp
# Opt level: O0

bool __thiscall LexerScanner::checkString(LexerScanner *this,char *c,int flags)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  bool bVar5;
  bool r;
  int flags_local;
  char *c_local;
  LexerScanner *this_local;
  
  pcVar1 = this->m_position;
  sVar4 = strlen(c);
  iVar3 = strncmp(pcVar1,c,sVar4);
  bVar5 = iVar3 == 0;
  if ((bVar5) && ((flags & 1U) != 0)) {
    pcVar1 = this->m_position;
    sVar4 = strlen(c);
    bVar2 = IsSymbolCharacter(pcVar1[sVar4],true);
    if (bVar2) {
      bVar5 = false;
    }
  }
  if ((bVar5 != false) && ((flags & 2U) == 0)) {
    sVar4 = strlen(c);
    this->m_position = this->m_position + sVar4;
  }
  return bVar5;
}

Assistant:

bool LexerScanner::checkString (const char* c, int flags)
{
	bool r = strncmp (m_position, c, strlen (c)) == 0;

	// There is to be a non-symbol character after words
	if (r and (flags & FCheckWord) and IsSymbolCharacter (m_position[strlen (c)], true))
		r = false;

	// Advance the cursor unless we want to just peek
	if (r and !(flags & FCheckPeek))
		m_position += strlen (c);

	return r;
}